

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O0

Bend * __thiscall OpenMD::SelectionManager::nextSelectedBend(SelectionManager *this,int *i)

{
  bool bVar1;
  size_t sVar2;
  reference ppBVar3;
  int *in_RSI;
  OpenMDBitSet *in_RDI;
  int bitIndex;
  
  *in_RSI = *in_RSI + 1;
  while( true ) {
    bitIndex = *in_RSI;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
               &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,2);
    sVar2 = OpenMDBitSet::size((OpenMDBitSet *)0x1c108a);
    if ((int)sVar2 <= bitIndex) {
      return (value_type)0x0;
    }
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
               &(in_RDI->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,2);
    bVar1 = OpenMDBitSet::operator[](in_RDI,bitIndex);
    if ((bVar1) &&
       (ppBVar3 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                            ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
                             &in_RDI[2].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                             (long)*in_RSI), *ppBVar3 != (value_type)0x0)) break;
    *in_RSI = *in_RSI + 1;
  }
  ppBVar3 = std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator[]
                      ((vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *)
                       &in_RDI[2].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                       (long)*in_RSI);
  return *ppBVar3;
}

Assistant:

Bend* SelectionManager::nextSelectedBend(int& i) {
#ifdef IS_MPI
    ++i;
    while (i < static_cast<int>(ss_.bitsets_[BEND].size())) {
      if (ss_.bitsets_[BEND][i]) {
        // check that this processor owns this bend
        if (bends_[i] != NULL) return bends_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[BEND].nextOnBit(i);
    return i == -1 ? NULL : bends_[i];
#endif
  }